

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  ulong uVar5;
  size_t sVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  short *psVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  
  uVar13 = 0xb;
  if (tableLog != 0) {
    uVar13 = (ulong)tableLog;
  }
  uVar19 = (uint)uVar13;
  sVar6 = 0xffffffffffffffff;
  if (4 < uVar19) {
    if (uVar19 < 0xd) {
      uVar9 = (int)total - 1;
      uVar10 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar9 = (uVar10 ^ 0xffffffe0) + 0x21;
      uVar10 = 0x1f;
      if (maxSymbolValue != 0) {
        for (; maxSymbolValue >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = (uVar10 ^ 0xffffffe0) + 0x22;
      if (uVar9 < uVar10) {
        uVar10 = uVar9;
      }
      if (uVar10 <= uVar19) {
        bVar3 = (byte)uVar13;
        cVar2 = -bVar3;
        bVar7 = cVar2 + 0x3e;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = total;
        iVar12 = 1 << (bVar3 & 0x1f);
        uVar20 = 0;
        uVar5 = 0;
        iVar16 = iVar12;
        for (uVar19 = 0; uVar10 = (uint)(total >> (bVar3 & 0x3f)), uVar19 <= maxSymbolValue;
            uVar19 = uVar19 + 1) {
          uVar17 = (ulong)count[uVar19];
          if (uVar17 == total) {
            return 0;
          }
          if (uVar17 == 0) {
            normalizedCounter[uVar19] = 0;
          }
          else if (uVar10 < count[uVar19]) {
            uVar17 = uVar17 * SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
            uVar15 = uVar17 >> (bVar7 & 0x3f);
            if ((uVar15 & 0xfff8) == 0) {
              uVar15 = (ulong)((int)uVar15 +
                              (uint)((ulong)FSE_normalizeCount::rtbTable[uVar15 & 0xffff] <<
                                     (cVar2 + 0x2aU & 0x3f) <
                                    uVar17 - ((uVar15 & 0xffff) << (bVar7 & 0x3f))));
            }
            uVar8 = (ushort)uVar15;
            if ((ushort)uVar5 < uVar8) {
              uVar20 = (ulong)uVar19;
            }
            if ((ushort)uVar5 < uVar8) {
              uVar5 = uVar15 & 0xffff;
            }
            normalizedCounter[uVar19] = uVar8;
            iVar16 = iVar16 - (int)(uVar15 & 0xffff);
          }
          else {
            normalizedCounter[uVar19] = -1;
            iVar16 = iVar16 + -1;
          }
        }
        sVar4 = normalizedCounter[uVar20];
        iVar14 = (int)sVar4 >> 1;
        if (iVar14 == -iVar16 || SBORROW4(iVar14,-iVar16) != iVar14 + iVar16 < 0) {
          uVar17 = total * 3 >> (bVar3 + 1 & 0x3f);
          uVar20 = (ulong)(maxSymbolValue + 1);
          uVar19 = 0;
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            uVar9 = count[uVar5];
            if ((ulong)uVar9 == 0) {
              normalizedCounter[uVar5] = 0;
            }
            else {
              if (uVar10 < uVar9) {
                if ((uint)uVar17 < uVar9) {
                  normalizedCounter[uVar5] = -2;
                  goto LAB_00176ca9;
                }
                normalizedCounter[uVar5] = 1;
              }
              else {
                normalizedCounter[uVar5] = -1;
              }
              uVar19 = uVar19 + 1;
              total = total - uVar9;
            }
LAB_00176ca9:
          }
          uVar10 = iVar12 - uVar19;
          uVar5 = (ulong)uVar10;
          if ((uVar17 & 0xffffffff) < total / uVar5) {
            uVar5 = total * 3;
            for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
              if ((normalizedCounter[uVar17] == -2) &&
                 (uVar9 = count[uVar17], uVar9 <= (uint)(uVar5 / (uVar10 * 2)))) {
                normalizedCounter[uVar17] = 1;
                uVar19 = uVar19 + 1;
                total = total - uVar9;
              }
            }
            uVar5 = (ulong)(iVar12 - uVar19);
          }
          iVar16 = (int)uVar5;
          if (uVar19 != maxSymbolValue + 1) {
            if (total == 0) {
              uVar19 = 0;
              while ((int)uVar5 != 0) {
                if (0 < normalizedCounter[uVar19]) {
                  uVar5 = (ulong)((int)uVar5 - 1);
                  normalizedCounter[uVar19] = normalizedCounter[uVar19] + 1;
                }
                bVar21 = uVar19 == maxSymbolValue;
                uVar19 = uVar19 + 1;
                if (bVar21) {
                  uVar19 = 0;
                }
              }
              return uVar13;
            }
            uVar17 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
            uVar19 = 0;
            uVar20 = uVar17;
            do {
              if (maxSymbolValue < uVar19) {
                return uVar13;
              }
              uVar15 = uVar20;
              if (normalizedCounter[uVar19] == -2) {
                uVar15 = (ulong)count[uVar19] * (((uVar5 << (bVar7 & 0x3f)) + uVar17) / total) +
                         uVar20;
                uVar20 = uVar20 >> (bVar7 & 0x3f);
                uVar18 = uVar15 >> (bVar7 & 0x3f);
                if (uVar18 == uVar20) {
                  return 0xffffffffffffffff;
                }
                normalizedCounter[uVar19] = (short)uVar18 - (short)uVar20;
              }
              uVar19 = uVar19 + 1;
              uVar20 = uVar15;
            } while( true );
          }
          uVar19 = 0;
          uVar17 = 0;
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            if (uVar19 < count[uVar5]) {
              uVar17 = uVar5 & 0xffffffff;
              uVar19 = count[uVar5];
            }
          }
          psVar11 = normalizedCounter + uVar17;
          sVar4 = *psVar11;
        }
        else {
          psVar11 = normalizedCounter + uVar20;
        }
        *psVar11 = sVar4 + (short)iVar16;
        sVar6 = uVar13;
      }
    }
    else {
      sVar6 = 0xffffffffffffffd4;
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            printf("%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            printf("Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}